

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrixFunction.cpp
# Opt level: O3

void getR(int itAtom,double *a,double theta,double (*R) [4])

{
  ulong *puVar1;
  ulong uVar2;
  int i;
  ulong *puVar3;
  undefined1 *puVar4;
  int j;
  int iVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  int j_1;
  long lVar9;
  double (*Q_00) [4];
  double dVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double v [3];
  double tmp [4] [4];
  double transposeT [4] [4];
  double T [4] [4];
  double Q [4] [4];
  double local_238 [4];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  ulong local_198 [16];
  ulong local_118 [16];
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar5 = itAtom * 3 + -3;
  lVar6 = 0;
  do {
    local_238[lVar6] = a[(itAtom * 3 + -6) + lVar6] - a[iVar5 + lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  dVar10 = 0.0;
  lVar6 = 0;
  do {
    dVar10 = dVar10 + local_238[lVar6] * local_238[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  lVar6 = 0;
  do {
    local_238[lVar6] = local_238[lVar6] / dVar10;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  Q_00 = (double (*) [4])&local_98;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  getQ(Q_00,local_238,theta);
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      if (lVar6 == 3 || lVar7 == 3) {
        (*Q_00)[lVar7] = 0.0;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    lVar6 = lVar6 + 1;
    Q_00 = Q_00 + 1;
  } while (lVar6 != 4);
  uStack_20 = 0x3ff0000000000000;
  puVar3 = local_118;
  lVar6 = 0;
  do {
    iVar11 = (int)((ulong)lVar6 >> 0x20);
    lVar7 = 0;
    auVar12 = _DAT_00106360;
    do {
      puVar1 = puVar3 + lVar7;
      *(undefined4 *)puVar1 = 0;
      *(uint *)((long)puVar1 + 4) =
           -(uint)((int)lVar6 == auVar12._0_4_ && iVar11 == auVar12._4_4_) & 0x3ff00000;
      *(undefined4 *)(puVar1 + 1) = 0;
      *(uint *)((long)puVar1 + 0xc) =
           -(uint)((int)lVar6 == auVar12._8_4_ && iVar11 == auVar12._12_4_) & 0x3ff00000;
      lVar7 = lVar7 + 2;
      lVar9 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar9 + 2;
    } while (lVar7 != 4);
    lVar6 = lVar6 + 1;
    puVar3 = puVar3 + 4;
  } while (lVar6 != 4);
  puVar3 = local_198;
  lVar6 = 0;
  do {
    iVar11 = (int)((ulong)lVar6 >> 0x20);
    lVar7 = 0;
    auVar13 = _DAT_00106360;
    do {
      puVar1 = puVar3 + lVar7;
      *(undefined4 *)puVar1 = 0;
      *(uint *)((long)puVar1 + 4) =
           -(uint)((int)lVar6 == auVar13._0_4_ && iVar11 == auVar13._4_4_) & 0x3ff00000;
      *(undefined4 *)(puVar1 + 1) = 0;
      *(uint *)((long)puVar1 + 0xc) =
           -(uint)((int)lVar6 == auVar13._8_4_ && iVar11 == auVar13._12_4_) & 0x3ff00000;
      lVar7 = lVar7 + 2;
      lVar9 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 2;
      auVar13._8_8_ = lVar9 + 2;
    } while (lVar7 != 4);
    lVar6 = lVar6 + 1;
    puVar3 = puVar3 + 4;
  } while (lVar6 != 4);
  lVar6 = 6;
  do {
    uVar2 = *(ulong *)((long)a + lVar6 + (long)iVar5 * 8 + -6);
    *(ulong *)((long)local_118 + lVar6 * 4) = uVar2;
    *(ulong *)((long)local_198 + lVar6 * 4) = uVar2 ^ 0x8000000000000000;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x1e);
  local_1a8 = (undefined1  [16])0x0;
  local_1b8 = (undefined1  [16])0x0;
  local_1c8 = (undefined1  [16])0x0;
  local_1d8 = (undefined1  [16])0x0;
  local_1e8 = (undefined1  [16])0x0;
  local_1f8 = (undefined1  [16])0x0;
  local_208 = (undefined1  [16])0x0;
  local_218 = (undefined1  [16])0x0;
  puVar3 = local_118;
  lVar6 = 0;
  do {
    lVar7 = 0;
    pdVar8 = &local_98;
    do {
      dVar10 = *(double *)(local_218 + lVar7 * 8 + lVar6 * 0x20);
      lVar9 = 0;
      do {
        dVar10 = dVar10 + *(double *)((long)puVar3 + lVar9) * *(double *)((long)pdVar8 + lVar9 * 4);
        lVar9 = lVar9 + 8;
      } while (lVar9 != 0x20);
      *(double *)(local_218 + lVar7 * 8 + lVar6 * 0x20) = dVar10;
      lVar7 = lVar7 + 1;
      pdVar8 = pdVar8 + 1;
    } while (lVar7 != 4);
    lVar6 = lVar6 + 1;
    puVar3 = puVar3 + 4;
  } while (lVar6 != 4);
  *(double *)((long)(R + 3) + 0x10) = 0.0;
  *(double *)((long)(R + 3) + 0x18) = 0.0;
  *(double *)((long)(R + 3) + 0) = 0.0;
  *(double *)((long)(R + 3) + 8) = 0.0;
  *(double *)((long)(R + 2) + 0x10) = 0.0;
  *(double *)((long)(R + 2) + 0x18) = 0.0;
  *(double *)((long)(R + 2) + 0) = 0.0;
  *(double *)((long)(R + 2) + 8) = 0.0;
  *(double *)((long)(R + 1) + 0x10) = 0.0;
  *(double *)((long)(R + 1) + 0x18) = 0.0;
  *(double *)((long)(R + 1) + 0) = 0.0;
  *(double *)((long)(R + 1) + 8) = 0.0;
  *(double *)((long)R + 0x10) = 0.0;
  *(double *)((long)R + 0x18) = 0.0;
  *(double *)((long)R + 0) = 0.0;
  *(double *)((long)R + 8) = 0.0;
  puVar4 = local_218;
  lVar6 = 0;
  do {
    lVar7 = 0;
    puVar3 = local_198;
    do {
      dVar10 = R[lVar6][lVar7];
      lVar9 = 0;
      do {
        dVar10 = dVar10 + *(double *)(puVar4 + lVar9) * *(double *)((long)puVar3 + lVar9 * 4);
        lVar9 = lVar9 + 8;
      } while (lVar9 != 0x20);
      R[lVar6][lVar7] = dVar10;
      lVar7 = lVar7 + 1;
      puVar3 = puVar3 + 1;
    } while (lVar7 != 4);
    lVar6 = lVar6 + 1;
    puVar4 = puVar4 + 0x20;
  } while (lVar6 != 4);
  return;
}

Assistant:

void getR(int itAtom, double * a, double theta, double R[4][4]){
    double v[3];
    int ii=(itAtom-2) *3, jj=(itAtom-1) *3;       // i: the x index of (itAtom-2)
    for (int k=0; k<3; k++)
        v[k] = a[ii+k] - a[jj+k];                             // v = Q(i-1) - Qi
    unitization(v);                                         // v[0]^2 + v[1]^2 + v[2]^2 = 1
    double Q[4][4];
    initialize_0(Q);
    getQ(Q, v, theta);          //set Q[3][3]
    for (int i=0; i<4; i++)
        for (int j=0; j<4; j++)
            if (i==3 || j==3)
                Q[i][j] = 0;
    Q[3][3] = 1;

    double T[4][4], transposeT[4][4];
    initialize_1(T);
    initialize_1(transposeT);
    jj=(itAtom-1) *3;
    for (int p=0; p<3; p++){
        T[p][3] = a[jj+p];
        transposeT[p][3] = -a[jj+p];
    }
    double tmp[4][4];
    matrixProduct(T, Q, tmp);
    matrixProduct(tmp, transposeT, R);
}